

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

ConstIterator * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::ConstIterator::operator++
          (ConstIterator *this,int param_2)

{
  ConstIterator *in_RSI;
  ConstIterator *in_RDI;
  
  if (in_RSI->m_index < 0) {
    memcpy(in_RDI,in_RSI,0x30);
  }
  else {
    memcpy(in_RDI,in_RSI,0x30);
    operator++(in_RSI);
  }
  return in_RDI;
}

Assistant:

typename SparseMatrix<ordering>::ConstIterator SparseMatrix<ordering>::ConstIterator::operator++(int)
    {
        if (m_index < 0) {
            //Iterator is not valid. We do nothing
            return *this;
        }
        ConstIterator newIterator(*this);
        ++newIterator;
        return newIterator;
    }